

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::disconnect(Session *this)

{
  SessionState *this_00;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  Mutex::lock(&this->m_mutex);
  if (this->m_pResponder != (Responder *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Disconnecting",&local_59);
    SessionState::onEvent(&this->m_state,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    (*this->m_pResponder->_vptr_Responder[3])();
    this->m_pResponder = (Responder *)0x0;
  }
  if (((this->m_state).m_receivedLogon != false) || ((this->m_state).m_sentLogon == true)) {
    (this->m_state).m_receivedLogon = false;
    (this->m_state).m_sentLogon = false;
    (**(code **)(*(long *)this->m_application + 0x20))(this->m_application,&this->m_sessionID);
  }
  this_00 = &this->m_state;
  (this->m_state).m_sentLogout = false;
  (this->m_state).m_sentReset = false;
  (this->m_state).m_receivedReset = false;
  SessionState::clearQueue(this_00);
  SessionState::logoutReason_abi_cxx11_(&local_38,this_00);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->m_resetOnDisconnect == true) {
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_58,&this->m_timestamper);
    SessionState::reset(this_00,(UtcTimeStamp *)&local_58);
  }
  (this->m_state).m_resendRange.first = 0;
  (this->m_state).m_resendRange.second = 0;
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void Session::disconnect() {
  Locker l(m_mutex);

  if (m_pResponder) {
    m_state.onEvent("Disconnecting");

    m_pResponder->disconnect();
    m_pResponder = 0;
  }

  if (m_state.receivedLogon() || m_state.sentLogon()) {
    m_state.receivedLogon(false);
    m_state.sentLogon(false);
    m_application.onLogout(m_sessionID);
  }

  m_state.sentLogout(false);
  m_state.receivedReset(false);
  m_state.sentReset(false);
  m_state.clearQueue();
  m_state.logoutReason();
  if (m_resetOnDisconnect) {
    m_state.reset(m_timestamper());
  }

  m_state.resendRange(0, 0);
}